

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::LE_Detonation_PDU::SetEventID(LE_Detonation_PDU *this,LE_EntityIdentifier *ID)

{
  LE_EntityIdentifier *this_00;
  KUINT16 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  KBOOL F;
  
  SetEventNumberIncludedFlag(this,true);
  KVar2 = ID->m_ui8ApplicationID;
  KVar1 = ID->m_ui16EntityID;
  (this->m_EventID).m_ui8SiteID = ID->m_ui8SiteID;
  (this->m_EventID).m_ui8ApplicationID = KVar2;
  (this->m_EventID).m_ui16EntityID = KVar1;
  this_00 = &(this->super_LE_Header).m_EntID;
  KVar2 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(this_00);
  KVar3 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(ID);
  if (KVar2 == KVar3) {
    KVar2 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(this_00);
    KVar3 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(ID);
    if (KVar2 == KVar3) {
      F = false;
      goto LAB_00280ebc;
    }
  }
  F = true;
LAB_00280ebc:
  SetEventIDSiteAppIncludedFlag(this,F);
  return;
}

Assistant:

void LE_Detonation_PDU::SetEventID( const LE_EntityIdentifier & ID )
{
    SetEventNumberIncludedFlag( true );
    m_EventID = ID;

    // Check if the id's site and application values
    // are the same, if they are we don't include them.
    if( m_EntID.GetSiteID() == ID.GetSiteID() &&
            m_EntID.GetApplicationID() == ID.GetApplicationID() )
    {
        // They match so don't include the fields
        SetEventIDSiteAppIncludedFlag( false );
    }
    else
    {
        // They don't match so we need to send these fields.
        SetEventIDSiteAppIncludedFlag( true );
    }
}